

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFontGlyph * __thiscall ImFont::FindGlyph(ImFont *this,ImWchar c)

{
  ulong uVar1;
  undefined2 in_register_00000032;
  
  if ((CONCAT22(in_register_00000032,c) < (this->IndexLookup).Size) &&
     (uVar1 = (ulong)(this->IndexLookup).Data[c], uVar1 != 0xffff)) {
    return (this->Glyphs).Data + uVar1;
  }
  return this->FallbackGlyph;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyph(ImWchar c) const
{
    if (c >= IndexLookup.Size)
        return FallbackGlyph;
    const ImWchar i = IndexLookup.Data[c];
    if (i == (ImWchar)-1)
        return FallbackGlyph;
    return &Glyphs.Data[i];
}